

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O0

Vec_Int_t * Seg_ManConvertResult(Seg_Man_t *p)

{
  int iVar1;
  int Entry2;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *vEdges2;
  int i;
  int iObj;
  int iFanin;
  Seg_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(1000);
  for (vEdges2._4_4_ = 0; iVar1 = Vec_IntSize(p->vEdges), vEdges2._4_4_ + 1 < iVar1;
      vEdges2._4_4_ = vEdges2._4_4_ + 2) {
    iVar1 = Vec_IntEntry(p->vEdges,vEdges2._4_4_);
    Entry2 = Vec_IntEntry(p->vEdges,vEdges2._4_4_ + 1);
    iVar2 = sat_solver_var_value(p->pSat,vEdges2._4_4_ / 2);
    if (iVar2 != 0) {
      Vec_IntPushTwo(p_00,iVar1,Entry2);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Seg_ManConvertResult( Seg_Man_t * p )
{
    int iFanin, iObj, i;
    Vec_Int_t * vEdges2 = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntryDouble( p->vEdges, iFanin, iObj, i )
        if ( sat_solver_var_value(p->pSat, i/2) )
            Vec_IntPushTwo( vEdges2, iFanin, iObj );
    return vEdges2;
}